

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::generateExpectedResult
          (string *__return_storage_ptr__,SparseTextureClampLookupColorTestCase *this,
          string *returnType,GLint level)

{
  bool bVar1;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  int local_13c;
  string local_138;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  float local_a4;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GLint local_24;
  string *psStack_20;
  GLint level_local;
  string *returnType_local;
  SparseTextureClampLookupColorTestCase *this_local;
  
  local_24 = level;
  psStack_20 = returnType;
  returnType_local = (string *)this;
  this_local = (SparseTextureClampLookupColorTestCase *)__return_storage_ptr__;
  bVar1 = std::operator==(returnType,"vec4");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"(",&local_69);
    local_a4 = (float)local_24 / 10.0 + 0.5;
    de::toString<float>(&local_a0,&local_a4);
    std::operator+(&local_48,&local_68,&local_a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,", 0, 0, 1)",&local_c9);
    std::operator+(__return_storage_ptr__,&local_48,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"(",&local_111);
    local_13c = local_24 * 10;
    de::toString<int>(&local_138,&local_13c);
    std::operator+(&local_f0,&local_110,&local_138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,", 0, 0, 1)",&local_161)
    ;
    std::operator+(__return_storage_ptr__,&local_f0,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SparseTextureClampLookupColorTestCase::generateExpectedResult(std::string returnType, GLint level)
{
	if (returnType == "vec4")
		return std::string("(") + de::toString(0.5f + (float)level / 10) + std::string(", 0, 0, 1)");
	else
		return std::string("(") + de::toString(level * 10) + std::string(", 0, 0, 1)");
}